

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

CURLcode Curl_rand(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  ulong local_40;
  ulong local_38;
  size_t left;
  uint r;
  CURLcode result;
  size_t num_local;
  uchar *rnd_local;
  Curl_easy *data_local;
  
  left._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  _r = num;
  num_local = (size_t)rnd;
  rnd_local = (uchar *)data;
  while( true ) {
    if (_r == 0) {
      return left._4_4_;
    }
    if (_r < 4) {
      local_40 = _r;
    }
    else {
      local_40 = 4;
    }
    local_38 = local_40;
    CVar1 = randit((Curl_easy *)rnd_local,(uint *)&left);
    if (CVar1 != CURLE_OK) break;
    for (; left._4_4_ = CURLE_OK, local_38 != 0; local_38 = local_38 - 1) {
      *(char *)num_local = (char)(uint)left;
      left._0_4_ = (uint)left >> 8;
      _r = _r - 1;
      num_local = num_local + 1;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_rand(struct Curl_easy *data, unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;

  DEBUGASSERT(num);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}